

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::PaddingLayerParams_PaddingConstant::ByteSizeLong
          (PaddingLayerParams_PaddingConstant *this)

{
  int iVar1;
  float fVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  PaddingLayerParams_PaddingConstant *this_local;
  
  sStack_18 = 0;
  fVar2 = value(this);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    sStack_18 = 5;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t PaddingLayerParams_PaddingConstant::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.PaddingLayerParams.PaddingConstant)
  size_t total_size = 0;

  // float value = 1;
  if (this->value() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}